

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O3

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_stadium
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx512bw> *this,
          PolarExtentCoreContext *ctx,PositionBatch<xsimd::batch<float,_xsimd::avx512bw>_> *position
          )

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  batch sin_angle;
  batch cos_angle;
  batch *pbVar8;
  PolarExtentCoreContext *ctx_00;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 in_stack_fffffffffffffed8 [14];
  ushort uVar23;
  undefined1 auVar24 [48];
  undefined1 auStack_e8 [16];
  
  pp_Var3 = this[0xc].super_PolarExtentCore._vptr_PolarExtentCore;
  pp_Var4 = this[0xd].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (ulong)this[0xb].super_PolarExtentCore._vptr_PolarExtentCore >> 0x20 | (long)pp_Var3 << 0x20;
  auVar9 = vpbroadcastd_avx512f(auVar19);
  pp_Var2 = this[0xc].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar20._8_8_ = pp_Var2;
  auVar20._0_8_ = pp_Var2;
  auVar10 = vbroadcastss_avx512f(auVar20);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (long)pp_Var4 << 0x20 | (ulong)pp_Var3 >> 0x20;
  auVar11 = vpbroadcastd_avx512f(auVar22);
  auVar17._0_8_ = ctx->num_points;
  auVar17._8_8_ = ctx->num_speakers;
  auVar17._16_8_ = ctx->real_num_speakers;
  auVar17._24_8_ = ctx->xs;
  auVar17._32_8_ = ctx->ys;
  auVar17._40_8_ = ctx->zs;
  auVar17._48_8_ = ctx->panning_results;
  auVar17._56_8_ = ctx->summed_panning_results;
  auVar16[0] = ctx->is_circular;
  auVar16._1_3_ = *(undefined3 *)&ctx->field_0x41;
  auVar16._4_4_ = ctx->flippedBasis[0];
  auVar16._8_4_ = ctx->flippedBasis[1];
  auVar16._12_4_ = ctx->flippedBasis[2];
  auVar16._16_4_ = ctx->flippedBasis[3];
  auVar16._20_4_ = ctx->flippedBasis[4];
  auVar16._24_4_ = ctx->flippedBasis[5];
  auVar16._28_4_ = ctx->flippedBasis[6];
  auVar16._32_4_ = ctx->flippedBasis[7];
  auVar16._36_4_ = ctx->flippedBasis[8];
  auVar16._40_4_ = ctx->circle_test[0];
  auVar16._44_4_ = ctx->circle_test[1];
  auVar16._48_4_ = ctx->right_circle_centre[0];
  auVar16._52_4_ = ctx->right_circle_centre[1];
  auVar16._56_4_ = ctx->cos_start_angle;
  auVar16._60_4_ = ctx->cos_end_angle;
  auVar15 = *(undefined1 (*) [64])&ctx->sin_start_angle;
  uVar1 = *(undefined4 *)((long)&this[9].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar12._16_4_ = uVar1;
  auVar12._20_4_ = uVar1;
  auVar12._24_4_ = uVar1;
  auVar12._28_4_ = uVar1;
  auVar12._32_4_ = uVar1;
  auVar12._36_4_ = uVar1;
  auVar12._40_4_ = uVar1;
  auVar12._44_4_ = uVar1;
  auVar12._48_4_ = uVar1;
  auVar12._52_4_ = uVar1;
  auVar12._56_4_ = uVar1;
  auVar12._60_4_ = uVar1;
  auVar12 = vmulps_avx512f(auVar15,auVar12);
  uVar1 = *(undefined4 *)&this[9].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar13._28_4_ = uVar1;
  auVar13._32_4_ = uVar1;
  auVar13._36_4_ = uVar1;
  auVar13._40_4_ = uVar1;
  auVar13._44_4_ = uVar1;
  auVar13._48_4_ = uVar1;
  auVar13._52_4_ = uVar1;
  auVar13._56_4_ = uVar1;
  auVar13._60_4_ = uVar1;
  auVar12 = vfmadd231ps_avx512f(auVar12,auVar16,auVar13);
  uVar1 = *(undefined4 *)((long)&this[8].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  auVar14._32_4_ = uVar1;
  auVar14._36_4_ = uVar1;
  auVar14._40_4_ = uVar1;
  auVar14._44_4_ = uVar1;
  auVar14._48_4_ = uVar1;
  auVar14._52_4_ = uVar1;
  auVar14._56_4_ = uVar1;
  auVar14._60_4_ = uVar1;
  auVar12 = vfmadd231ps_avx512f(auVar12,auVar17,auVar14);
  uVar1 = *(undefined4 *)&this[0xb].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar6._16_4_ = uVar1;
  auVar6._20_4_ = uVar1;
  auVar6._24_4_ = uVar1;
  auVar6._28_4_ = uVar1;
  auVar6._32_4_ = uVar1;
  auVar6._36_4_ = uVar1;
  auVar6._40_4_ = uVar1;
  auVar6._44_4_ = uVar1;
  auVar6._48_4_ = uVar1;
  auVar6._52_4_ = uVar1;
  auVar6._56_4_ = uVar1;
  auVar6._60_4_ = uVar1;
  auVar13 = vmulps_avx512f(auVar15,auVar6);
  uVar1 = *(undefined4 *)((long)&this[10].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar7._4_4_ = uVar1;
  auVar7._0_4_ = uVar1;
  auVar7._8_4_ = uVar1;
  auVar7._12_4_ = uVar1;
  auVar7._16_4_ = uVar1;
  auVar7._20_4_ = uVar1;
  auVar7._24_4_ = uVar1;
  auVar7._28_4_ = uVar1;
  auVar7._32_4_ = uVar1;
  auVar7._36_4_ = uVar1;
  auVar7._40_4_ = uVar1;
  auVar7._44_4_ = uVar1;
  auVar7._48_4_ = uVar1;
  auVar7._52_4_ = uVar1;
  auVar7._56_4_ = uVar1;
  auVar7._60_4_ = uVar1;
  auVar13 = vfmadd231ps_avx512f(auVar13,auVar16,auVar7);
  auVar14 = vmulps_avx512f(auVar15,auVar11);
  uVar1 = *(undefined4 *)&this[10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15._16_4_ = uVar1;
  auVar15._20_4_ = uVar1;
  auVar15._24_4_ = uVar1;
  auVar15._28_4_ = uVar1;
  auVar15._32_4_ = uVar1;
  auVar15._36_4_ = uVar1;
  auVar15._40_4_ = uVar1;
  auVar15._44_4_ = uVar1;
  auVar15._48_4_ = uVar1;
  auVar15._52_4_ = uVar1;
  auVar15._56_4_ = uVar1;
  auVar15._60_4_ = uVar1;
  auVar15 = vfmadd231ps_avx512f(auVar13,auVar17,auVar15);
  auVar16 = vfmadd231ps_avx512f(auVar14,auVar16,auVar10);
  auVar17 = vfmadd231ps_avx512f(auVar16,auVar17,auVar9);
  auVar16 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
  auVar12 = vandps_avx512dq(auVar12,auVar16);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = pp_Var4;
  auVar13 = vpbroadcastd_avx512f(auVar18);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (long)this[0xe].super_PolarExtentCore._vptr_PolarExtentCore << 0x20 | (ulong)pp_Var4 >> 0x20;
  auVar14 = vpbroadcastd_avx512f(auVar21);
  auVar14 = vmulps_avx512f(auVar15,auVar14);
  auVar13 = vfmadd231ps_avx512f(auVar14,auVar12,auVar13);
  auVar24 = auVar13._0_48_;
  auStack_e8 = auVar13._48_16_;
  uVar5 = vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar13,2);
  uVar23 = (ushort)uVar5;
  vandps_avx512dq(auVar17,auVar16);
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[3].
  _2_2_ = uVar23;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data._0_14_
       = in_stack_fffffffffffffed8;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[4] =
       (float)auVar24._0_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[5] =
       (float)auVar24._4_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[6] =
       (float)auVar24._8_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[7] =
       (float)auVar24._12_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[8] =
       (float)auVar24._16_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[9] =
       (float)auVar24._20_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[10] =
       (float)auVar24._24_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xb] =
       (float)auVar24._28_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xc] =
       (float)auVar24._32_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xd] =
       (float)auVar24._36_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xe] =
       (float)auVar24._40_4_;
  sin_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xf] =
       (float)auVar24._44_4_;
  weight_from_sin(__return_storage_ptr__,this,ctx,sin_angle);
  uVar1 = *(undefined4 *)((long)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore + 4);
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar9._16_4_ = uVar1;
  auVar9._20_4_ = uVar1;
  auVar9._24_4_ = uVar1;
  auVar9._28_4_ = uVar1;
  auVar9._32_4_ = uVar1;
  auVar9._36_4_ = uVar1;
  auVar9._40_4_ = uVar1;
  auVar9._44_4_ = uVar1;
  auVar9._48_4_ = uVar1;
  auVar9._52_4_ = uVar1;
  auVar9._56_4_ = uVar1;
  auVar9._60_4_ = uVar1;
  auVar17 = vmulps_avx512f(auVar15,auVar9);
  uVar1 = *(undefined4 *)&this[0xe].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  auVar10._16_4_ = uVar1;
  auVar10._20_4_ = uVar1;
  auVar10._24_4_ = uVar1;
  auVar10._28_4_ = uVar1;
  auVar10._32_4_ = uVar1;
  auVar10._36_4_ = uVar1;
  auVar10._40_4_ = uVar1;
  auVar10._44_4_ = uVar1;
  auVar10._48_4_ = uVar1;
  auVar10._52_4_ = uVar1;
  auVar10._56_4_ = uVar1;
  auVar10._60_4_ = uVar1;
  vfmadd231ps_avx512f(auVar17,auVar12,auVar10);
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[3].
  _2_2_ = uVar23;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data._0_14_
       = in_stack_fffffffffffffed8;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[4] =
       (float)auVar24._0_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[5] =
       (float)auVar24._4_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[6] =
       (float)auVar24._8_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[7] =
       (float)auVar24._12_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[8] =
       (float)auVar24._16_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[9] =
       (float)auVar24._20_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[10] =
       (float)auVar24._24_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xb] =
       (float)auVar24._28_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xc] =
       (float)auVar24._32_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xd] =
       (float)auVar24._36_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xe] =
       (float)auVar24._40_4_;
  cos_angle.super_simd_register<float,_xsimd::avx512bw>.super_simd_register<float,_xsimd::avx512dq>.
  super_simd_register<float,_xsimd::avx512cd>.super_simd_register<float,_xsimd::avx512f>.data[0xf] =
       (float)auVar24._44_4_;
  pbVar8 = weight_from_cos(__return_storage_ptr__,this,ctx_00,cos_angle);
  if ((uVar23 != 0) &&
     (pbVar8 = (batch *)CONCAT44((int)((ulong)pbVar8 >> 0x20),(uint)uVar23), uVar23 != 0xffff)) {
    auVar11._48_16_ = auStack_e8;
    auVar11._0_48_ = auVar24;
    vcmpps_avx512f(ZEXT1664(ZEXT816(0) << 0x40),auVar11,2);
  }
  return pbVar8;
}

Assistant:

batch weight_stadium(PolarExtentCoreContext &ctx,
                         const PositionBatch<batch> &position) const {
      PositionBatch<batch> position_t = position.transform(ctx.flippedBasis);

      PositionBatch<batch> position_t_right = position_t;
      position_t_right.x = xsimd::abs(position_t.x);

      auto circle_test_dot =
          xsimd::fma(position_t_right.x, batch{ctx.circle_test[0]},
                     position_t_right.y * batch{ctx.circle_test[1]});
      auto in_straight_line_part = circle_test_dot >= batch{0.0};

      // for the straight line part
      auto straight_val = weight_from_sin(ctx, xsimd::abs(position_t.z));

      // for the circle part
      auto circle_dot =
          xsimd::fma(position_t_right.x, batch{ctx.right_circle_centre[0]},
                     position_t_right.y * batch{ctx.right_circle_centre[1]});
      auto circle_val = weight_from_cos(ctx, circle_dot);

      if (xsimd::all(in_straight_line_part))
        return straight_val;
      else if (xsimd::none(in_straight_line_part))
        return circle_val;
      else
        return xsimd::select(in_straight_line_part, straight_val, circle_val);
    }